

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void readSOS(FILE *f)

{
  ulong in_RAX;
  uint uVar1;
  int iVar2;
  uchar v [1];
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  EnterNewSection(f,"SOS");
  fseek((FILE *)f,1,1);
  iVar2 = 3;
  do {
    fread((void *)((long)&uStack_38 + 7),1,1,(FILE *)f);
    printf(anon_var_dwarf_2f58,uStack_38 >> 0x38);
    fread((void *)((long)&uStack_38 + 7),1,1,(FILE *)f);
    uVar1 = (uint)uStack_38._7_1_;
    printf(anon_var_dwarf_2f63,(ulong)(uStack_38._7_1_ >> 4));
    printf(anon_var_dwarf_2f7a,(ulong)(uVar1 & 0xf));
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  fseek((FILE *)f,3,1);
  return;
}

Assistant:

void readSOS(FILE *f) {
    unsigned int len = EnterNewSection(f, "SOS");

    fseek(f, 1, SEEK_CUR);   // 顏色分量數，固定為3
    for (int i = 0; i < 3; i++) {
        unsigned char v[1];
        fread(v, 1, 1, f);
        printf("顏色分量id：%d\n", v[0]);
        fread(v, 1, 1, f);
        printf("DC霍夫曼id：%d\n", v[0] >> 4);
        printf("AC霍夫曼id：%d\n", v[0] & 0x0F);
    }
    fseek(f, 3, SEEK_CUR);
}